

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVST3LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  int iVar2;
  DecodeStatus DVar3;
  uint *Decoder_00;
  uint64_t extraout_RDX;
  uint64_t Address_00;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t Address_03;
  uint RegNo;
  uint uVar4;
  DecodeStatus local_3c;
  
  local_3c = MCDisassembler_Fail;
  Decoder_00 = &switchD_00150714::switchdataD_001c9fb0;
  switch(Insn >> 10 & 3) {
  case 0:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar4 = Insn >> 5 & 7;
    iVar2 = 1;
    goto LAB_00150771;
  case 1:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar4 = Insn >> 6 & 3;
    uVar1 = Insn & 0x20;
    break;
  case 2:
    if ((Insn & 0x30) != 0) {
      return MCDisassembler_Fail;
    }
    uVar4 = Insn >> 7 & 1;
    uVar1 = Insn & 0x40;
    break;
  case 3:
    goto switchD_00150714_caseD_3;
  }
  iVar2 = 2 - (uint)(uVar1 == 0);
LAB_00150771:
  RegNo = Insn >> 0x10 & 0xf;
  uVar1 = Insn & 0xf;
  if (uVar1 == 0xf) {
    local_3c = MCDisassembler_Success;
  }
  else {
    local_3c = DecodeGPRRegisterClass(Inst,RegNo,Address,&switchD_00150714::switchdataD_001c9fb0);
    Decoder_00 = (uint *)(ulong)(local_3c | 2);
    Address = extraout_RDX;
    if ((local_3c | 2) != MCDisassembler_Success) {
      return MCDisassembler_Fail;
    }
  }
  DVar3 = DecodeGPRRegisterClass(Inst,RegNo,Address,Decoder_00);
  if (DVar3 != MCDisassembler_Success) {
    if (DVar3 != MCDisassembler_SoftFail) {
      return MCDisassembler_Fail;
    }
    local_3c = MCDisassembler_SoftFail;
  }
  MCOperand_CreateImm0(Inst,0);
  Address_01 = Address_00;
  if (uVar1 != 0xf) {
    if (uVar1 == 0xd) {
      MCOperand_CreateReg0(Inst,0);
      Address_01 = extraout_RDX_00;
    }
    else {
      DVar3 = DecodeGPRRegisterClass(Inst,uVar1,Address_00,Decoder_00);
      Address_01 = extraout_RDX_01;
      if (DVar3 != MCDisassembler_Success) {
        if (DVar3 != MCDisassembler_SoftFail) {
          return MCDisassembler_Fail;
        }
        local_3c = MCDisassembler_SoftFail;
      }
    }
  }
  uVar1 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  DVar3 = DecodeDPRRegisterClass(Inst,uVar1,Address_01,Decoder_00);
  if (DVar3 == MCDisassembler_Success) {
LAB_00150846:
    DVar3 = DecodeDPRRegisterClass(Inst,iVar2 + uVar1,Address_02,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) goto LAB_00150896;
      local_3c = MCDisassembler_SoftFail;
    }
    DVar3 = DecodeDPRRegisterClass(Inst,uVar1 + iVar2 * 2,Address_03,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_3c = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar4);
  }
  else {
    if (DVar3 == MCDisassembler_SoftFail) {
      local_3c = MCDisassembler_SoftFail;
      goto LAB_00150846;
    }
LAB_00150896:
    local_3c = MCDisassembler_Fail;
  }
switchD_00150714_caseD_3:
  return local_3c;
}

Assistant:

static DecodeStatus DecodeVST3LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 4, 2))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}